

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

void pystring::split(string *str,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *result,string *sep,int maxsplit)

{
  size_type sVar1;
  ulong uVar2;
  pointer pcVar3;
  __type _Var4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(result);
  local_7c = 0x7fffffff;
  if ((uint)maxsplit < 0x7fffffff) {
    local_7c = maxsplit;
  }
  sVar1 = sep->_M_string_length;
  uVar2 = str->_M_string_length;
  if (sVar1 != 0) {
    uVar9 = 0;
LAB_0010633b:
    lVar6 = sVar1 + uVar9;
    lVar11 = 0;
    local_38 = lVar6;
    do {
      uVar7 = lVar6 + lVar11;
      if (uVar2 < uVar7) goto LAB_001063f5;
      if ((str->_M_dataplus)._M_p[lVar11 + uVar9] == *(sep->_M_dataplus)._M_p) {
        std::__cxx11::string::substr((ulong)&local_58,(ulong)str);
        _Var4 = std::operator==(&local_58,sep);
        std::__cxx11::string::~string((string *)&local_58);
        lVar6 = local_38;
        if (_Var4) goto LAB_001063b7;
      }
      lVar11 = lVar11 + 1;
    } while( true );
  }
  uVar9 = 0;
  while( true ) {
    uVar7 = uVar9;
    pcVar3 = (str->_M_dataplus)._M_p;
    uVar9 = uVar7;
    do {
      if (uVar2 <= uVar7) goto LAB_001064ec;
      while ((uVar9 = uVar2, uVar2 != uVar7 &&
             (iVar5 = ::isspace((int)pcVar3[uVar7]), uVar9 = uVar7, iVar5 != 0))) {
        uVar7 = uVar7 + 1;
      }
      uVar10 = uVar9;
      uVar8 = uVar2;
      if (uVar2 < uVar9) {
        uVar8 = uVar9;
      }
      while ((uVar7 = uVar8, uVar8 != uVar10 &&
             (iVar5 = ::isspace((int)pcVar3[uVar10]), uVar7 = uVar10, iVar5 == 0))) {
        uVar10 = uVar10 + 1;
      }
    } while (uVar7 <= uVar9);
    if (local_7c < 1) break;
    std::__cxx11::string::substr((ulong)&local_58,(ulong)str);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_58
              );
    local_7c = local_7c + -1;
    std::__cxx11::string::~string((string *)&local_58);
    pcVar3 = (str->_M_dataplus)._M_p;
    uVar10 = uVar2;
    if (uVar2 < uVar7) {
      uVar10 = uVar7;
    }
    while ((uVar9 = uVar10, uVar10 != uVar7 &&
           (iVar5 = ::isspace((int)pcVar3[uVar7]), uVar9 = uVar7, iVar5 != 0))) {
      uVar7 = uVar7 + 1;
    }
  }
LAB_001064ec:
  if (uVar2 <= uVar9) {
    return;
  }
  std::__cxx11::string::substr((ulong)&local_58,(ulong)str);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_58);
LAB_00106516:
  std::__cxx11::string::~string((string *)&local_58);
  return;
LAB_001063b7:
  if (local_7c < 1) goto LAB_001063f5;
  std::__cxx11::string::substr((ulong)&local_58,(ulong)str);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_58);
  local_7c = local_7c + -1;
  std::__cxx11::string::~string((string *)&local_58);
  uVar9 = uVar7;
  goto LAB_0010633b;
LAB_001063f5:
  std::__cxx11::string::substr((ulong)&local_58,(ulong)str);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_58);
  goto LAB_00106516;
}

Assistant:

void split( const std::string & str, std::vector< std::string > & result, const std::string & sep, int maxsplit )
    {
        result.clear();

        if ( maxsplit < 0 ) maxsplit = MAX_32BIT_INT;//result.max_size();


        if ( sep.size() == 0 )
        {
            split_whitespace( str, result, maxsplit );
            return;
        }

        std::string::size_type i,j, len = str.size(), n = sep.size();

        i = j = 0;

        while ( i+n <= len )
        {
            if ( str[i] == sep[0] && str.substr( i, n ) == sep )
            {
                if ( maxsplit-- <= 0 ) break;

                result.push_back( str.substr( j, i - j ) );
                i = j = i + n;
            }
            else
            {
                i++;
            }
        }

        result.push_back( str.substr( j, len-j ) );
    }